

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Transform::deleteStore
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Transform *this,Path *path)

{
  Client *client;
  string local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Path *local_20;
  Path *path_local;
  Transform *this_local;
  
  client = *(Client **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Transform *)__return_storage_ptr__;
  Vault::operator+(&local_80,"store/",path);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this,&local_60);
  HttpConsumer::del(__return_storage_ptr__,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Transform::deleteStore(const Path &path) {
  return HttpConsumer::del(client_, getUrl(Path{"store/" + path}));
}